

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_alloc_gatscat_buf(Integer nelems)

{
  Integer nelem;
  
  nelem = pnga_nnodes();
  if (GA_prealloc_gatscat != 0) {
    pnga_error("Gather/scatter buffers already allocated",nelems);
  }
  GA_prealloc_gatscat = (int)nelems;
  GA_header = (Integer *)pnga_malloc(nelem,0x3f2,"ga_gat_header");
  GA_list = (Integer *)pnga_malloc(nelems,0x3f2,"ga_gat_list");
  GA_elems = (Integer *)pnga_malloc(nelem,0x3f2,"ga_gat_nelems");
  return;
}

Assistant:

void pnga_alloc_gatscat_buf(Integer nelems)
{
  Integer nprocs = pnga_nnodes();
  if (GA_prealloc_gatscat)
    pnga_error("Gather/scatter buffers already allocated",nelems);
  GA_prealloc_gatscat = nelems;
  GA_header =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_header");
  GA_list =(Integer *)pnga_malloc(nelems, MT_F_INT, "ga_gat_list");
  GA_elems =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_nelems");
}